

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameObject.cpp
# Opt level: O2

bool __thiscall GameObject::CheckCollision(GameObject *this,int x,int y,int radius)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  for (iVar2 = -radius; iVar2 <= radius; iVar2 = iVar2 + 1) {
    iVar1 = -radius;
    while (iVar3 = iVar1, iVar3 <= radius) {
      iVar1 = iVar3 + 1;
      if ((iVar2 + (int)this->pos_x == x) && (y - (int)this->pos_y == iVar3)) goto LAB_00103d44;
    }
  }
LAB_00103d44:
  return iVar2 <= radius;
}

Assistant:

bool GameObject::CheckCollision(int x, int y, int radius)
{

  //is pos X or pos Y inside the point/radius?
for(int i=-radius;i<=radius;i++)
  { 
    for(int j=-radius;j<=radius;j++)
    { 

      if((static_cast<int>(pos_x)+i ==  x) && (static_cast<int>(pos_y)+j == y))
      {
        return true;
      }
    }

  } 
/*   if(static_cast<int>(pos_x) ==  x && static_cast<int>(pos_y) == y) ||
      {
        return true;
      }
 */     
  return false;

}